

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

void lodepng_color_mode_alloc_palette(LodePNGColorMode *info)

{
  uchar *puVar1;
  long lVar2;
  
  if (info->palette == (uchar *)0x0) {
    puVar1 = (uchar *)malloc(0x400);
    info->palette = puVar1;
  }
  if (info->palette != (uchar *)0x0) {
    lVar2 = 0;
    do {
      info->palette[lVar2 * 4] = '\0';
      info->palette[lVar2 * 4 + 1] = '\0';
      info->palette[lVar2 * 4 + 2] = '\0';
      info->palette[lVar2 * 4 + 3] = 0xff;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x100);
  }
  return;
}

Assistant:

static void lodepng_color_mode_alloc_palette(LodePNGColorMode* info) {
  size_t i;
  /*if the palette is already allocated, it will have size 1024 so no reallocation needed in that case*/
  /*the palette must have room for up to 256 colors with 4 bytes each.*/
  if(!info->palette) info->palette = (unsigned char*)lodepng_malloc(1024);
  if(!info->palette) return; /*alloc fail*/
  for(i = 0; i != 256; ++i) {
    /*Initialize all unused colors with black, the value used for invalid palette indices.
    This is an error according to the PNG spec, but common PNG decoders make it black instead.
    That makes color conversion slightly faster due to no error handling needed.*/
    info->palette[i * 4 + 0] = 0;
    info->palette[i * 4 + 1] = 0;
    info->palette[i * 4 + 2] = 0;
    info->palette[i * 4 + 3] = 255;
  }
}